

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_content_type.cpp
# Opt level: O0

void __thiscall cppcms::http::content_type::parse(content_type *this,char *begin,char *end)

{
  element_type *peVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *begin_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  char *in_RSI;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_basic_string<char>_>_>::value,_pair<iterator,_bool>_>
  _Var4;
  char *tmp_1;
  char *tmp;
  string value;
  string param;
  char *param_end;
  string subtype;
  string type;
  char *type_end;
  char *in_stack_fffffffffffffd38;
  undefined7 in_stack_fffffffffffffd40;
  undefined1 in_stack_fffffffffffffd47;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd48;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd50;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd68;
  string local_198 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_178;
  string local_170 [32];
  char *local_150;
  undefined8 local_148;
  undefined8 local_140;
  undefined8 local_138;
  allocator<char> local_129;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_108;
  string local_100 [32];
  string local_e0 [32];
  char *local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  char *local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  allocator<char> local_79;
  string local_78 [32];
  int local_58;
  allocator<char> local_41;
  string local_40 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  local_18 = in_RDX;
  local_10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             protocol::skip_ws<char_const*>(in_RSI,(char *)in_RDX);
  if ((local_10 != local_18) &&
     (local_20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 protocol::tocken<char_const*>
                           ((char *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                            in_stack_fffffffffffffd38), local_20 != local_10)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char_const*,void>
              (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58._M_current,
               in_stack_fffffffffffffd50._M_current,
               (allocator<char> *)in_stack_fffffffffffffd48._M_current);
    std::allocator<char>::~allocator(&local_41);
    local_10 = local_20;
    if ((local_20 == local_18) ||
       (local_10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &local_20->field_0x1, local_20->_M_dataplus != (_Alloc_hider)0x2f)) {
      local_58 = 1;
    }
    else {
      local_20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 protocol::tocken<char_const*>
                           ((char *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                            in_stack_fffffffffffffd38);
      if (local_20 == local_10) {
        local_58 = 1;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<char_const*,void>
                  (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58._M_current,
                   in_stack_fffffffffffffd50._M_current,
                   (allocator<char> *)in_stack_fffffffffffffd48._M_current);
        std::allocator<char>::~allocator(&local_79);
        local_10 = local_20;
        local_88 = std::__cxx11::string::begin();
        local_90 = std::__cxx11::string::end();
        local_98 = std::__cxx11::string::begin();
        local_a0 = (char *)std::
                           transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char(*)(char)>
                                     (in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
                                      in_stack_fffffffffffffd48,
                                      (_func_char_char *)
                                      CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40))
        ;
        local_a8 = std::__cxx11::string::begin();
        local_b0 = std::__cxx11::string::end();
        local_b8 = std::__cxx11::string::begin();
        local_c0 = (char *)std::
                           transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char(*)(char)>
                                     (in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
                                      in_stack_fffffffffffffd48,
                                      (_func_char_char *)
                                      CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40))
        ;
        peVar1 = std::
                 __shared_ptr_access<cppcms::http::content_type::data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cppcms::http::content_type::data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x3cbfc8);
        std::__cxx11::string::operator=((string *)peVar1,local_40);
        peVar1 = std::
                 __shared_ptr_access<cppcms::http::content_type::data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cppcms::http::content_type::data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x3cbfe7);
        std::__cxx11::string::operator=((string *)&peVar1->subtype,local_78);
        std::operator+(in_stack_fffffffffffffd68,(char *)in_stack_fffffffffffffd60);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffd48._M_current,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40));
        peVar1 = std::
                 __shared_ptr_access<cppcms::http::content_type::data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cppcms::http::content_type::data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x3cc047);
        std::__cxx11::string::operator=((string *)&peVar1->media_type,local_e0);
        std::__cxx11::string::~string(local_e0);
        std::__cxx11::string::~string(local_100);
        do {
          if (local_10 == local_18) {
            local_58 = 0;
            break;
          }
          pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   protocol::skip_ws<char_const*>((char *)local_10,(char *)local_18);
          local_10 = pbVar2;
          if (((pbVar2 == local_18) ||
              (local_10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &pbVar2->field_0x1, pbVar2->_M_dataplus != (_Alloc_hider)0x3b)) ||
             (local_10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         protocol::skip_ws<char_const*>((char *)local_10,(char *)local_18),
             local_10 == local_18)) {
            local_58 = 1;
            break;
          }
          local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      protocol::tocken<char_const*>
                                ((char *)CONCAT17(in_stack_fffffffffffffd47,
                                                  in_stack_fffffffffffffd40),
                                 in_stack_fffffffffffffd38);
          if (local_108 == local_10) {
            local_58 = 1;
            break;
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<char_const*,void>
                    (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58._M_current,
                     in_stack_fffffffffffffd50._M_current,
                     (allocator<char> *)in_stack_fffffffffffffd48._M_current);
          std::allocator<char>::~allocator(&local_129);
          pbVar2 = &local_128;
          local_138 = std::__cxx11::string::begin();
          local_140 = std::__cxx11::string::end();
          local_148 = std::__cxx11::string::begin();
          local_150 = (char *)std::
                              transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char(*)(char)>
                                        (in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
                                         in_stack_fffffffffffffd48,
                                         (_func_char_char *)
                                         CONCAT17(in_stack_fffffffffffffd47,
                                                  in_stack_fffffffffffffd40));
          begin_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     protocol::skip_ws<char_const*>((char *)local_108,(char *)local_18);
          local_10 = begin_00;
          if ((begin_00 == local_18) ||
             (local_10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &begin_00->field_0x1, begin_00->_M_dataplus != (_Alloc_hider)0x3d)) {
            local_58 = 1;
          }
          else {
            in_stack_fffffffffffffd60 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 protocol::skip_ws<char_const*>((char *)local_10,(char *)local_18);
            local_10 = in_stack_fffffffffffffd60;
            if (in_stack_fffffffffffffd60 == local_18) {
              local_58 = 1;
            }
            else {
              std::__cxx11::string::string(local_170);
              if (local_10->_M_dataplus == (_Alloc_hider)0x22) {
                local_178 = local_10;
                protocol::unquote<char_const*>((char **)begin_00,(char *)in_stack_fffffffffffffd60);
                std::__cxx11::string::operator=(local_170,local_198);
                std::__cxx11::string::~string(local_198);
                if (local_178 == local_10) {
                  local_58 = 1;
                }
                else {
                  local_10 = local_178;
LAB_003cc4d2:
                  peVar1 = std::
                           __shared_ptr_access<cppcms::http::content_type::data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<cppcms::http::content_type::data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)0x3cc4df);
                  in_stack_fffffffffffffd50._M_current = (char *)&peVar1->parameters;
                  std::make_pair<std::__cxx11::string&,std::__cxx11::string&>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffd48._M_current,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40));
                  _Var4 = std::
                          map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                                    ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)in_stack_fffffffffffffd50._M_current,
                                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)in_stack_fffffffffffffd48._M_current);
                  in_stack_fffffffffffffd48._M_current = (char *)_Var4.first._M_node;
                  in_stack_fffffffffffffd47 = _Var4.second;
                  std::
                  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40));
                  local_58 = 0;
                }
              }
              else {
                pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         protocol::tocken<char_const*>
                                   ((char *)CONCAT17(in_stack_fffffffffffffd47,
                                                     in_stack_fffffffffffffd40),
                                    in_stack_fffffffffffffd38);
                in_stack_fffffffffffffd58._M_current = (char *)pbVar3;
                if (pbVar3 != local_10) {
                  std::__cxx11::string::assign<char_const*,void>
                            (pbVar2,(char *)begin_00,(char *)in_stack_fffffffffffffd60);
                  local_10 = pbVar3;
                  goto LAB_003cc4d2;
                }
                local_58 = 1;
              }
              std::__cxx11::string::~string(local_170);
            }
          }
          std::__cxx11::string::~string((string *)&local_128);
        } while (local_58 == 0);
        std::__cxx11::string::~string(local_78);
      }
    }
    std::__cxx11::string::~string(local_40);
  }
  return;
}

Assistant:

void content_type::parse(char const *begin,char const *end)
	{
		begin = protocol::skip_ws(begin,end);	
		if(begin == end)
			return;
		char const *type_end = protocol::tocken(begin,end);
		if(type_end == begin)
			return;
		std::string type(begin,type_end);
		begin = type_end;
		if(begin == end || *begin++ != '/')
			return;
		type_end = protocol::tocken(begin,end);
		if(type_end == begin)
			return;
		std::string subtype(begin,type_end);
		begin = type_end;
		std::transform(type.begin(),type.end(),type.begin(),protocol::ascii_to_lower);
		std::transform(subtype.begin(),subtype.end(),subtype.begin(),protocol::ascii_to_lower);
		d->type = type;
		d->subtype = subtype;
		d->media_type = type + "/" + subtype;
		while(begin!=end) {
			begin = protocol::skip_ws(begin,end);
			if(begin == end || *begin++ != ';' || (begin=protocol::skip_ws(begin,end))==end)
				return;
			char const *param_end = protocol::tocken(begin,end);
			if(param_end == begin)
				return;
			std::string param(begin,param_end);
			std::transform(param.begin(),param.end(),param.begin(),protocol::ascii_to_lower);
			begin = protocol::skip_ws(param_end,end);
			if(begin==end || *begin++!='=')
				return;
			begin = protocol::skip_ws(begin,end);
			if(begin==end)
				return;
			std::string value;
			if(*begin == '"') {
				char const *tmp = begin;
				value = protocol::unquote(tmp,end);
				if(tmp == begin)
					return;
				begin = tmp;
			}
			else {
				char const *tmp = protocol::tocken(begin,end);
				if(tmp == begin)
					return;
				value.assign(begin,tmp);
				begin = tmp;
			}
			d->parameters.insert(std::make_pair(param,value));
		}
	}